

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_multiplicative_expression(Analyser *this)

{
  optional<Token> next;
  _Storage<Token,_false> local_70;
  char local_50;
  _Storage<Token,_false> local_48;
  
  analyse_unary_expression(this);
  nextToken((optional<Token> *)&local_70._M_value,this);
  do {
    if (local_50 != '\x01') {
LAB_0010f9a5:
      std::_Optional_payload_base<Token>::_M_reset
                ((_Optional_payload_base<Token> *)&local_70._M_value);
      return;
    }
    if (local_70._M_value._type == MULTIPLICATION_SIGN) {
      analyse_unary_expression(this);
      local_48._0_8_ = 3;
      local_48._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&local_48._M_value);
    }
    else {
      if (local_70._M_value._type != DIVISION_SIGN) {
        unreadToken(this);
        goto LAB_0010f9a5;
      }
      analyse_unary_expression(this);
      local_48._0_8_ = 4;
      local_48._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&local_48._M_value);
    }
    nextToken((optional<Token> *)&local_48._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&local_70._M_value,
               (_Optional_payload_base<Token> *)&local_48._M_value);
    std::_Optional_payload_base<Token>::_M_reset
              ((_Optional_payload_base<Token> *)&local_48._M_value);
  } while( true );
}

Assistant:

void Analyser::analyse_multiplicative_expression() {
	analyse_unary_expression();
	auto next = nextToken();

	while (next.has_value()) {
		auto type = next.value().GetType();
		switch (type)
		{
		case TokenType::MULTIPLICATION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::imul));
			break;
		case TokenType::DIVISION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::idiv));
			break;
		default:
			unreadToken();
			return;
		}
		next = nextToken();
	}
	return;
}